

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O0

void __thiscall MemoryImage::getPage(MemoryImage *this,uintb addr,uint1 *res,int4 skip,int4 size)

{
  LoadImage *pLVar1;
  uint uVar2;
  uint1 *puVar3;
  int4 i;
  DataUnavailError *err;
  Address local_40;
  AddrSpace *local_30;
  AddrSpace *spc;
  int4 size_local;
  int4 skip_local;
  uint1 *res_local;
  uintb addr_local;
  MemoryImage *this_local;
  
  spc._0_4_ = size;
  spc._4_4_ = skip;
  _size_local = res;
  res_local = (uint1 *)addr;
  addr_local = (uintb)this;
  local_30 = MemoryBank::getSpace(&this->super_MemoryBank);
  puVar3 = _size_local;
  uVar2 = (uint)spc;
  pLVar1 = this->loader;
  Address::Address(&local_40,local_30,(uintb)(res_local + spc._4_4_));
  (*pLVar1->_vptr_LoadImage[2])(pLVar1,puVar3,(ulong)uVar2,&local_40);
  return;
}

Assistant:

void MemoryImage::getPage(uintb addr,uint1 *res,int4 skip,int4 size) const

{  // Assume that -addr- is page aligned
  AddrSpace *spc = getSpace();

  try {
    loader->loadFill(res,size,Address(spc,addr+skip));
  }
  catch(DataUnavailError &err) {
    // Pages not mapped in the load image, are assumed to be zero
    for(int4 i=0;i<size;++i)
      res[i] = 0;
  }
}